

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_export.cpp
# Opt level: O3

CopyFunction * __thiscall
duckdb::LogicalExport::GetCopyFunction
          (CopyFunction *__return_storage_ptr__,LogicalExport *this,ClientContext *context,
          CopyInfo *info)

{
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> oVar1;
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> entry;
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> local_70;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,anon_var_dwarf_4f18422 + 9);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"main","");
  local_70 = Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                       (context,&local_48,&local_68,&info->format,THROW_EXCEPTION,
                        (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true>::CheckValid(&local_70);
  oVar1.ptr = local_70.ptr;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  CopyFunction::CopyFunction(__return_storage_ptr__,&(oVar1.ptr)->function);
  return __return_storage_ptr__;
}

Assistant:

CopyFunction LogicalExport::GetCopyFunction(ClientContext &context, CopyInfo &info) {
	auto &copy_entry =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, INVALID_CATALOG, DEFAULT_SCHEMA, info.format);
	return copy_entry.function;
}